

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_branch_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_15b219::CpuBranchTest::branch_test
          (CpuBranchTest *this,uint8_t branch_flag,int8_t offset,uint8_t expected_cycles)

{
  char cVar1;
  undefined2 uVar2;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_00;
  ActionInterface<unsigned_char_(unsigned_short)> *impl;
  undefined7 in_register_00000011;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_90;
  code *local_80;
  undefined1 local_70 [8];
  MatcherBase<unsigned_short> local_68;
  MatcherBase<unsigned_short> local_50;
  char *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  (this->super_CpuTest).registers.p = branch_flag;
  (this->super_CpuTest).expected.p = branch_flag;
  uVar2 = (this->super_CpuTest).registers.pc;
  (this->super_CpuTest).expected.pc = (short)CONCAT71(in_register_00000011,offset) + uVar2 + 2;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_50,uVar2 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_70,
             &(this->super_CpuTest).mmu.super_MockMmu,(Matcher<unsigned_short> *)&local_50);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                      ((MockSpec<unsigned_char_(unsigned_short)> *)local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_branch_instructions.cpp"
                       ,0x14,"mmu","read_byte(registers.pc + 1)");
  local_38 = (char *)operator_new(1);
  *local_38 = offset;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<signed_char*>(&local_30,local_38);
  impl = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a6398;
  cVar1 = *local_38;
  *(char *)&impl[1]._vptr_ActionInterface = cVar1;
  *(char *)((long)&impl[1]._vptr_ActionInterface + 1) = cVar1;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_90,impl);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (this_00,(Action<unsigned_char_(unsigned_short)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_70)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_50);
  if (expected_cycles != '\0') {
    do {
      (*(((this->super_CpuTest).cpu._M_t.
          super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
          _M_t.
          super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
          .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu).
        _vptr_ICpu[2])();
      expected_cycles = expected_cycles + 0xff;
    } while (expected_cycles != '\0');
  }
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_70,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_68.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_68.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_branch_instructions.cpp"
               ,0x17,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((long *)local_90._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_90._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_68.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_70)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_68.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

void branch_test(uint8_t branch_flag,
            int8_t offset,
            uint8_t expected_cycles) {
        expected.p = registers.p = branch_flag;
        expected.pc = registers.pc + static_cast<uint8_t>(2) + offset;

        EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(offset));

        step_execution(expected_cycles);
        EXPECT_EQ(expected, registers);
    }